

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::loadsummaryxref(summarycalc *this,string *filename)

{
  ulong __new_size;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  string file;
  fmsummaryxref s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&file,(string *)filename);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   &this->inputpath_,&local_50);
    std::__cxx11::string::operator=((string *)&file,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","loadsummaryxref",file._M_dataplus._M_p);
  }
  else {
    init_o_to_s(this);
    while( true ) {
      sVar2 = fread(&s,0xc,1,__stream);
      iVar1 = s.summary_id;
      if ((int)sVar2 == 0) {
        fclose(__stream);
        std::__cxx11::string::~string((string *)&file);
        return;
      }
      lVar4 = (long)s.summaryset_id;
      if (9 < lVar4) break;
      if (this->fout[lVar4] != (FILE *)0x0) {
        if (s.summary_id < this->min_summary_id_[lVar4]) {
          this->min_summary_id_[lVar4] = s.summary_id;
        }
        if (this->max_summary_id_[lVar4] < s.summary_id) {
          this->max_summary_id_[lVar4] = s.summary_id;
        }
        this_00 = this->co_to_s_[lVar4];
        piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = (long)s.output_id;
        __new_size = lVar5 + 1;
        if ((ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) < __new_size) {
          local_50._M_dataplus._M_p._0_4_ = 0;
          std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size,(value_type *)&local_50)
          ;
          piVar3 = (this->co_to_s_[lVar4]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        piVar3[lVar5] = iVar1;
      }
    }
    fprintf(_stderr,"FATAL: %s: Invalid summaryset id  %d found in %s\n","loadsummaryxref",
            (ulong)(uint)s.summaryset_id,file._M_dataplus._M_p);
  }
  exit(-1);
}

Assistant:

void summarycalc::loadsummaryxref(const std::string& filename)
{
	std::string file = filename;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, file.c_str());
		::exit(-1);
	}

	init_o_to_s();

	fmsummaryxref s;
	int i = (int)fread(&s, sizeof(fmsummaryxref), 1, fin);
	while (i != 0) {
		if (s.summaryset_id > 9) {
			fprintf(stderr, "FATAL: %s: Invalid summaryset id  %d found in %s\n", __func__, s.summaryset_id, file.c_str());
			::exit(-1);
		}
		if (fout[s.summaryset_id] != nullptr) {
			if (s.summary_id < min_summary_id_[s.summaryset_id]) min_summary_id_[s.summaryset_id] = s.summary_id;
			if (s.summary_id > max_summary_id_[s.summaryset_id]) max_summary_id_[s.summaryset_id] = s.summary_id;
			if ( (*co_to_s_[s.summaryset_id]).size() < (size_t)(s.output_id + 1)) (*co_to_s_[s.summaryset_id]).resize(s.output_id + 1, 0);
			(*co_to_s_[s.summaryset_id])[s.output_id] = s.summary_id ;
		}
		i = (int) fread(&s, sizeof(fmsummaryxref), 1, fin);
	}

		fclose(fin);
}